

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ext_early_data_add_serverhello(SSL_HANDSHAKE *hs,CBB *out)

{
  int iVar1;
  bool bVar2;
  
  bVar2 = true;
  if ((hs->ssl->s3->field_0xdd & 2) != 0) {
    iVar1 = CBB_add_u16(out,0x2a);
    bVar2 = false;
    if (iVar1 != 0) {
      iVar1 = CBB_add_u16(out,0);
      bVar2 = false;
      if (iVar1 != 0) {
        iVar1 = CBB_flush(out);
        bVar2 = iVar1 != 0;
      }
    }
  }
  return bVar2;
}

Assistant:

static bool ext_early_data_add_serverhello(SSL_HANDSHAKE *hs, CBB *out) {
  if (!hs->ssl->s3->early_data_accepted) {
    return true;
  }

  if (!CBB_add_u16(out, TLSEXT_TYPE_early_data) ||  //
      !CBB_add_u16(out, 0) ||                       //
      !CBB_flush(out)) {
    return false;
  }

  return true;
}